

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManCollectVisited(Aig_Man_t *pAig,Vec_Ptr_t *vFanout,Vec_Ptr_t *vVisited)

{
  Aig_Obj_t *pObj;
  int i;
  
  vVisited->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  for (i = 0; i < vFanout->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vFanout,i);
    Cgt_ManCollectVisited_rec(pAig,pObj,vVisited);
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited( Aig_Man_t * pAig, Vec_Ptr_t * vFanout, Vec_Ptr_t * vVisited )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vVisited );
    Aig_ManIncrementTravId( pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
        Cgt_ManCollectVisited_rec( pAig, pObj, vVisited );
}